

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder_internal.h
# Opt level: O3

void __thiscall basist::selector::set_selector(selector *this,uint32_t x,uint32_t y,uint32_t val)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  byte bVar4;
  ulong uVar5;
  
  if ((y | x | val) < 4) {
    bVar1 = (char)x * '\x02';
    this->m_selectors[y] =
         (byte)(val << (bVar1 & 0x1f)) | ~(byte)(3 << (bVar1 & 0x1f)) & this->m_selectors[y];
    uVar3 = y + x * 4;
    bVar2 = (byte)uVar3 & 7;
    uVar5 = (ulong)(3 - (uVar3 >> 3));
    bVar1 = "\x03\x02"[val];
    bVar4 = ~(byte)(1 << bVar2);
    this->m_bytes[uVar5] = (byte)((bVar1 & 1) << bVar2) | this->m_bytes[uVar5] & bVar4;
    this->m_selectors[uVar5 + 2] = (bVar1 >> 1) << bVar2 | bVar4 & this->m_selectors[uVar5 + 2];
    return;
  }
  __assert_fail("(x | y | val) < 4",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder_internal.h"
                ,0x2fe,"void basist::selector::set_selector(uint32_t, uint32_t, uint32_t)");
}

Assistant:

void set_selector(uint32_t x, uint32_t y, uint32_t val)
		{
			static const uint8_t s_selector_index_to_etc1[4] = { 3, 2, 0, 1 };

			assert((x | y | val) < 4);

			m_selectors[y] &= ~(3 << (x * 2));
			m_selectors[y] |= (val << (x * 2));

			const uint32_t etc1_bit_index = x * 4 + y;

			uint8_t *p = &m_bytes[3 - (etc1_bit_index >> 3)];

			const uint32_t byte_bit_ofs = etc1_bit_index & 7;
			const uint32_t mask = 1 << byte_bit_ofs;

			const uint32_t etc1_val = s_selector_index_to_etc1[val];

			const uint32_t lsb = etc1_val & 1;
			const uint32_t msb = etc1_val >> 1;

			p[0] &= ~mask;
			p[0] |= (lsb << byte_bit_ofs);

			p[-2] &= ~mask;
			p[-2] |= (msb << byte_bit_ofs);
		}